

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

EStatusCode __thiscall CFFFileInput::ReadCharStrings(CFFFileInput *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  CharStrings *pCVar4;
  LongFilePositionType inNewOffset;
  long lVar5;
  CharStrings *local_60;
  LongFilePositionType charStringsPosition;
  unsigned_long i;
  EStatusCode status;
  CFFFileInput *this_local;
  
  uVar2 = CONCAT62(0,this->mFontsCount);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pCVar4 = (CharStrings *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_60 = pCVar4;
    do {
      CharStrings::CharStrings(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != pCVar4 + uVar2);
  }
  this->mCharStrings = pCVar4;
  i._0_4_ = eSuccess;
  for (charStringsPosition = 0;
      (ulong)charStringsPosition < (ulong)this->mFontsCount && (EStatusCode)i == eSuccess;
      charStringsPosition = charStringsPosition + 1) {
    inNewOffset = GetCharStringsPosition(this,(unsigned_short)charStringsPosition);
    lVar5 = GetCharStringType(this,(unsigned_short)charStringsPosition);
    this->mCharStrings[charStringsPosition].mCharStringsType = (Byte)lVar5;
    if (inNewOffset == 0) {
      this->mCharStrings[charStringsPosition].mCharStringsCount = 0;
      this->mCharStrings[charStringsPosition].mCharStringsIndex = (CharStringsIndex)0x0;
    }
    else {
      CFFPrimitiveReader::SetOffset(&this->mPrimitivesReader,inNewOffset);
      i._0_4_ = ReadSubrsFromIndex(this,&this->mCharStrings[charStringsPosition].mCharStringsCount,
                                   &this->mCharStrings[charStringsPosition].mCharStringsIndex);
    }
  }
  if ((EStatusCode)i == eSuccess) {
    this_local._4_4_ = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  }
  else {
    this_local._4_4_ = (EStatusCode)i;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFFileInput::ReadCharStrings()
{
	// scan all charstrings of all included fonts
	mCharStrings = new CharStrings[mFontsCount];
	EStatusCode status = PDFHummus::eSuccess;

	for(unsigned long i=0; i < mFontsCount && (PDFHummus::eSuccess == status); ++i)
	{
		LongFilePositionType  charStringsPosition = GetCharStringsPosition(i);	
		mCharStrings[i].mCharStringsType = (Byte)GetCharStringType(i);
		if(0 == charStringsPosition)
		{
			mCharStrings[i].mCharStringsCount = 0;
			mCharStrings[i].mCharStringsIndex = NULL;
		}
		else
		{
			mPrimitivesReader.SetOffset(charStringsPosition);
			status = ReadSubrsFromIndex(mCharStrings[i].mCharStringsCount,
										&(mCharStrings[i].mCharStringsIndex));
		}
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}